

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O3

void Saig_ManCexMinGetCos(Aig_Man_t *pAig,Abc_Cex_t *pCex,Vec_Int_t *vLeaves,Vec_Int_t *vRoots)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  long lVar5;
  
  vRoots->nSize = 0;
  if (vLeaves != (Vec_Int_t *)0x0) {
    iVar2 = vLeaves->nSize;
    if (0 < iVar2) {
      lVar5 = 0;
      do {
        pVVar1 = pAig->vObjs;
        if (pVVar1 == (Vec_Ptr_t *)0x0) {
          piVar4 = (int *)0x0;
        }
        else {
          uVar3 = vLeaves->pArray[lVar5];
          if (((int)uVar3 < 0) || (pVVar1->nSize <= (int)uVar3)) goto LAB_00524783;
          piVar4 = (int *)pVVar1->pArray[uVar3];
        }
        if (((piVar4[6] & 7U) == 2) && (pAig->nTruePis <= *piVar4)) {
          uVar3 = (*piVar4 - pAig->nTruePis) + pAig->nTruePos;
          if (((int)uVar3 < 0) || (pAig->vCos->nSize <= (int)uVar3)) goto LAB_00524783;
          Vec_IntPush(vRoots,*(int *)((long)pAig->vCos->pArray[uVar3] + 0x24));
          iVar2 = vLeaves->nSize;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar2);
    }
    return;
  }
  iVar2 = pCex->iPo;
  if ((-1 < (long)iVar2) && (iVar2 < pAig->vCos->nSize)) {
    Vec_IntPush(vRoots,*(int *)((long)pAig->vCos->pArray[iVar2] + 0x24));
    return;
  }
LAB_00524783:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the roots to begin traversal.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Saig_ManCexMinGetCos( Aig_Man_t * pAig, Abc_Cex_t * pCex, Vec_Int_t * vLeaves, Vec_Int_t * vRoots )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_IntClear( vRoots );
    if ( vLeaves == NULL )
    {
        pObj = Aig_ManCo( pAig, pCex->iPo );
        Vec_IntPush( vRoots, Aig_ObjId(pObj) );
        return;
    }
    Aig_ManForEachObjVec( vLeaves, pAig, pObj, i )
        if ( Saig_ObjIsLo(pAig, pObj) )
            Vec_IntPush( vRoots, Aig_ObjId( Saig_ObjLoToLi(pAig, pObj) ) );
}